

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ei_kissfft_impl.h
# Opt level: O2

void __thiscall
Eigen::internal::kissfft_impl<double>::fwd
          (kissfft_impl<double> *this,Complex *dst,Scalar *src,int nfft)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double dVar4;
  PlanData *this_00;
  Complex *pCVar5;
  long lVar6;
  size_t __n;
  int nfft_00;
  long lVar7;
  long lVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_40;
  double dStack_38;
  
  nfft_00 = nfft >> 1;
  if ((nfft & 3U) == 0) {
    pCVar5 = real_twiddles(this,nfft >> 2);
    fwd(this,dst,(Complex *)src,nfft_00);
    dVar1 = *(double *)dst->_M_value;
    dVar2 = *(double *)(dst->_M_value + 8);
    lVar6 = (long)nfft_00;
    lVar8 = 0;
    lVar3 = lVar6 * 0x10;
    for (lVar7 = 1; lVar7 <= nfft >> 2; lVar7 = lVar7 + 1) {
      local_40 = *(double *)(dst[1]._M_value + lVar8);
      dVar9 = *(double *)((long)(dst[1]._M_value + lVar8) + 8);
      dVar10 = *(double *)(dst[-1]._M_value + lVar3);
      dVar4 = *(double *)((long)(dst[-1]._M_value + lVar3) + 8);
      dVar11 = local_40 + dVar10;
      dStack_38 = dVar9 + dVar4;
      local_40 = local_40 - dVar10;
      dVar9 = dVar9 - dVar4;
      dVar10 = dVar11;
      std::operator*((complex<double> *)&local_40,(complex<double> *)(pCVar5->_M_value + lVar8));
      *(double *)(dst[1]._M_value + lVar8) = (dVar11 + extraout_XMM0_Qa) * 0.5;
      *(double *)((long)(dst[1]._M_value + lVar8) + 8) = (dVar9 + dVar10) * 0.5;
      *(double *)(dst[-1]._M_value + lVar3) = (dVar11 - extraout_XMM0_Qa) * 0.5;
      *(double *)((long)(dst[-1]._M_value + lVar3) + 8) = (dVar9 - dVar10) * -0.5;
      lVar8 = lVar8 + 0x10;
      lVar3 = lVar3 + -0x10;
    }
    *(double *)dst->_M_value = dVar1 + dVar2;
    *(undefined8 *)(dst->_M_value + 8) = 0;
    *(double *)dst[lVar6]._M_value = dVar1 - dVar2;
    *(undefined8 *)(dst[lVar6]._M_value + 8) = 0;
  }
  else {
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (&this->m_tmpBuf1,(long)nfft);
    this_00 = get_plan(this,nfft,false);
    kiss_cpx_fft<double>::work<double>
              (this_00,0,
               (this->m_tmpBuf1).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start,src,1,1);
    __n = (long)nfft_00 * 0x10 + 0x10;
    if (__n != 0) {
      memmove(dst,(this->m_tmpBuf1).
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,__n);
      return;
    }
  }
  return;
}

Assistant:

inline
    void fwd( Complex * dst,const Scalar * src,int nfft) 
    {
      if ( nfft&3  ) {
        // use generic mode for odd
        m_tmpBuf1.resize(nfft);
        get_plan(nfft,false).work(0, &m_tmpBuf1[0], src, 1,1);
        std::copy(m_tmpBuf1.begin(),m_tmpBuf1.begin()+(nfft>>1)+1,dst );
      }else{
        int ncfft = nfft>>1;
        int ncfft2 = nfft>>2;
        Complex * rtw = real_twiddles(ncfft2);

        // use optimized mode for even real
        fwd( dst, reinterpret_cast<const Complex*> (src), ncfft);
        Complex dc(dst[0].real() +  dst[0].imag());
        Complex nyquist(dst[0].real() -  dst[0].imag());
        int k;
        for ( k=1;k <= ncfft2 ; ++k ) {
          Complex fpk = dst[k];
          Complex fpnk = conj(dst[ncfft-k]);
          Complex f1k = fpk + fpnk;
          Complex f2k = fpk - fpnk;
          Complex tw= f2k * rtw[k-1];
          dst[k] =  (f1k + tw) * Scalar(.5);
          dst[ncfft-k] =  conj(f1k -tw)*Scalar(.5);
        }
        dst[0] = dc;
        dst[ncfft] = nyquist;
      }
    }